

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compound_dictionary.cpp
# Opt level: O0

PreparedDictionary *
CreatePreparedDictionaryWithParams
          (MemoryManager *m,uint8_t *source,size_t source_size,uint32_t bucket_bits,
          uint32_t slot_bits,uint32_t hash_bits,uint16_t bucket_limit)

{
  short sVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  void *__s;
  ulong uVar9;
  PreparedDictionary *p;
  byte bVar10;
  byte bVar11;
  uint in_ECX;
  long lVar12;
  long lVar13;
  ulong in_RDX;
  long in_RSI;
  uint in_R8D;
  uint32_t in_R9D;
  ushort in_stack_00000008;
  size_t cursor;
  size_t j_1;
  uint32_t pos;
  uint32_t count_2;
  uint32_t slot;
  uint32_t size;
  uint32_t count_1;
  size_t j;
  uint32_t limit;
  int overflow;
  uint16_t count;
  uint32_t key;
  uint64_t h;
  uint32_t total_items;
  uint32_t *slot_limit;
  uint32_t *slot_size;
  uint32_t i;
  uint8_t **source_ref;
  uint32_t *items;
  uint16_t *heads;
  uint32_t *slot_offsets;
  uint32_t *next_bucket;
  uint32_t *bucket_heads;
  uint16_t *num;
  PreparedDictionary *result;
  uint8_t *flat;
  size_t alloc_size;
  uint32_t slot_mask;
  uint64_t hash_mask;
  uint32_t hash_shift;
  uint32_t num_buckets;
  uint32_t num_slots;
  uint64_t t;
  size_t in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  void *local_128;
  long local_120;
  ulong local_118;
  uint local_10c;
  uint local_108;
  uint local_100;
  uint local_fc;
  ulong local_f8;
  ushort local_e6;
  uint local_d4;
  uint local_bc;
  
  bVar10 = (byte)in_R8D;
  uVar6 = 1 << (bVar10 & 0x1f);
  bVar11 = (byte)in_ECX;
  uVar7 = 1 << (bVar11 & 0x1f);
  local_d4 = 0;
  if (((0x10 < in_R8D) || (in_ECX < in_R8D)) || (0xf < in_ECX - in_R8D)) {
    return (PreparedDictionary *)0x0;
  }
  if ((4L << (bVar10 & 0x3f)) + (4L << (bVar10 & 0x3f)) + (2L << (bVar11 & 0x3f)) +
      (4L << (bVar11 & 0x3f)) + in_RDX * 4 == 0) {
    local_128 = (void *)0x0;
  }
  else {
    local_128 = duckdb_brotli::BrotliAllocate
                          ((MemoryManager *)
                           CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                           in_stack_fffffffffffffec8);
  }
  __s = (void *)((long)local_128 + (ulong)uVar6 * 4 + (ulong)uVar6 * 4);
  lVar5 = (ulong)uVar7 * 4 + (ulong)uVar7 * 2;
  memset(__s,0,(ulong)uVar7 << 1);
  for (local_bc = 0; local_bc + 7 < in_RDX; local_bc = local_bc + 1) {
    uVar9 = (*(ulong *)(in_RSI + (ulong)local_bc) &
            0xffffffffffffffffU >> (0x40U - (char)in_R9D & 0x3f)) * 0x1fe35a7bd3579bd3 >>
            (0x40 - bVar11 & 0x3f);
    sVar1 = *(short *)((long)__s + (uVar9 & 0xffffffff) * 2);
    if (sVar1 == 0) {
      in_stack_fffffffffffffed4 = 0xffffffff;
    }
    else {
      in_stack_fffffffffffffed4 =
           *(undefined4 *)((long)__s + (uVar9 & 0xffffffff) * 4 + (ulong)uVar7 * 2);
    }
    *(undefined4 *)((long)__s + (ulong)local_bc * 4 + lVar5) = in_stack_fffffffffffffed4;
    *(uint *)((long)__s + (uVar9 & 0xffffffff) * 4 + (ulong)uVar7 * 2) = local_bc;
    local_e6 = sVar1 + 1;
    if (in_stack_00000008 < local_e6) {
      local_e6 = in_stack_00000008;
    }
    *(ushort *)((long)__s + (uVar9 & 0xffffffff) * 2) = local_e6;
  }
  local_bc = 0;
LAB_0075b85d:
  if (uVar6 <= local_bc) {
    if ((4L << (bVar10 & 0x3f)) + (2L << (bVar11 & 0x3f)) + (ulong)local_d4 * 4 == -0x20) {
      p = (PreparedDictionary *)0x0;
    }
    else {
      p = (PreparedDictionary *)
          duckdb_brotli::BrotliAllocate
                    ((MemoryManager *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                     in_stack_fffffffffffffec8);
    }
    lVar12 = (ulong)uVar6 * 4;
    lVar13 = (ulong)uVar7 * 2;
    p->magic = 0xdebcede3;
    p->num_items = local_d4;
    p->source_size = (uint32_t)in_RDX;
    p->hash_bits = in_R9D;
    p->bucket_bits = in_ECX;
    p->slot_bits = in_R8D;
    *(long *)((long)&p[1].magic + (ulong)local_d4 * 4 + lVar13 + lVar12) = in_RSI;
    local_d4 = 0;
    for (local_bc = 0; local_bc < uVar6; local_bc = local_bc + 1) {
      (&p[1].magic)[local_bc] = local_d4;
      local_d4 = *(int *)((long)local_128 + (ulong)local_bc * 4) + local_d4;
      *(undefined4 *)((long)local_128 + (ulong)local_bc * 4) = 0;
    }
    for (local_bc = 0; local_bc < uVar7; local_bc = local_bc + 1) {
      uVar8 = local_bc & uVar6 - 1;
      local_108 = (uint)*(ushort *)((long)__s + (ulong)local_bc * 2);
      uVar2 = *(uint *)((long)local_128 + (ulong)uVar8 * 4);
      if (*(uint *)((long)local_128 + (ulong)uVar8 * 4 + (ulong)uVar6 * 4) < local_108) {
        local_108 = *(uint *)((long)local_128 + (ulong)uVar8 * 4 + (ulong)uVar6 * 4);
      }
      if (local_108 == 0) {
        *(undefined2 *)((long)&p[1].magic + (ulong)local_bc * 2 + lVar12) = 0xffff;
      }
      else {
        *(short *)((long)&p[1].magic + (ulong)local_bc * 2 + lVar12) = (short)uVar2;
        uVar3 = (&p[1].magic)[uVar8];
        *(uint *)((long)local_128 + (ulong)uVar8 * 4) =
             local_108 + *(int *)((long)local_128 + (ulong)uVar8 * 4);
        local_10c = *(uint *)((long)__s + (ulong)local_bc * 4 + (ulong)uVar7 * 2);
        local_120 = (ulong)uVar3 + (ulong)uVar2;
        for (local_118 = 0; local_118 < local_108; local_118 = local_118 + 1) {
          *(uint *)((long)&p[1].magic + local_120 * 4 + lVar13 + lVar12) = local_10c;
          local_10c = *(uint *)((long)__s + (ulong)local_10c * 4 + lVar5);
          local_120 = local_120 + 1;
        }
        *(uint *)((long)&p->slot_bits + local_120 * 4 + lVar13 + lVar12) =
             *(uint *)((long)&p->slot_bits + local_120 * 4 + lVar13 + lVar12) | 0x80000000;
      }
    }
    duckdb_brotli::BrotliFree
              ((MemoryManager *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),p);
    return p;
  }
  *(uint *)((long)local_128 + (ulong)local_bc * 4 + (ulong)uVar6 * 4) = (uint)in_stack_00000008;
  do {
    uVar2 = *(uint *)((long)local_128 + (ulong)local_bc * 4 + (ulong)uVar6 * 4);
    local_fc = 0;
    bVar4 = false;
    for (local_f8 = (ulong)local_bc; local_f8 < uVar7; local_f8 = uVar6 + local_f8) {
      local_100 = (uint)*(ushort *)((long)__s + local_f8 * 2);
      if (0xfffe < local_fc) {
        bVar4 = true;
        break;
      }
      if (uVar2 < local_100) {
        local_100 = uVar2;
      }
      local_fc = local_100 + local_fc;
    }
    if (!bVar4) break;
    *(int *)((long)local_128 + (ulong)local_bc * 4 + (ulong)uVar6 * 4) =
         *(int *)((long)local_128 + (ulong)local_bc * 4 + (ulong)uVar6 * 4) + -1;
  } while( true );
  *(uint *)((long)local_128 + (ulong)local_bc * 4) = local_fc;
  local_d4 = local_fc + local_d4;
  local_bc = local_bc + 1;
  goto LAB_0075b85d;
}

Assistant:

static PreparedDictionary* CreatePreparedDictionaryWithParams(MemoryManager* m,
    const uint8_t* source, size_t source_size, uint32_t bucket_bits,
    uint32_t slot_bits, uint32_t hash_bits, uint16_t bucket_limit) {
  /* Step 1: create "bloated" hasher. */
  uint32_t num_slots = 1u << slot_bits;
  uint32_t num_buckets = 1u << bucket_bits;
  uint32_t hash_shift = 64u - bucket_bits;
  uint64_t hash_mask = (~((uint64_t)0U)) >> (64 - hash_bits);
  uint32_t slot_mask = num_slots - 1;
  size_t alloc_size = (sizeof(uint32_t) << slot_bits) +
      (sizeof(uint32_t) << slot_bits) +
      (sizeof(uint16_t) << bucket_bits) +
      (sizeof(uint32_t) << bucket_bits) +
      (sizeof(uint32_t) * source_size);
  uint8_t* flat = NULL;
  PreparedDictionary* result = NULL;
  uint16_t* num = NULL;
  uint32_t* bucket_heads = NULL;
  uint32_t* next_bucket = NULL;
  uint32_t* slot_offsets = NULL;
  uint16_t* heads = NULL;
  uint32_t* items = NULL;
  uint8_t** source_ref = NULL;
  uint32_t i;
  uint32_t* slot_size = NULL;
  uint32_t* slot_limit = NULL;
  uint32_t total_items = 0;
  if (slot_bits > 16) return NULL;
  if (slot_bits > bucket_bits) return NULL;
  if (bucket_bits - slot_bits >= 16) return NULL;

  flat = BROTLI_ALLOC(m, uint8_t, alloc_size);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(flat)) return NULL;

  slot_size = (uint32_t*)flat;
  slot_limit = (uint32_t*)(&slot_size[num_slots]);
  num = (uint16_t*)(&slot_limit[num_slots]);
  bucket_heads = (uint32_t*)(&num[num_buckets]);
  next_bucket = (uint32_t*)(&bucket_heads[num_buckets]);
  memset(num, 0, num_buckets * sizeof(num[0]));

  /* TODO(eustas): apply custom "store" order. */
  for (i = 0; i + 7 < source_size; ++i) {
    const uint64_t h = (BROTLI_UNALIGNED_LOAD64LE(&source[i]) & hash_mask) *
        kPreparedDictionaryHashMul64Long;
    const uint32_t key = (uint32_t)(h >> hash_shift);
    uint16_t count = num[key];
    next_bucket[i] = (count == 0) ? ((uint32_t)(-1)) : bucket_heads[key];
    bucket_heads[key] = i;
    count++;
    if (count > bucket_limit) count = bucket_limit;
    num[key] = count;
  }

  /* Step 2: find slot limits. */
  for (i = 0; i < num_slots; ++i) {
    BROTLI_BOOL overflow = BROTLI_FALSE;
    slot_limit[i] = bucket_limit;
    while (BROTLI_TRUE) {
      uint32_t limit = slot_limit[i];
      size_t j;
      uint32_t count = 0;
      overflow = BROTLI_FALSE;
      for (j = i; j < num_buckets; j += num_slots) {
        uint32_t size = num[j];
        /* Last chain may span behind 64K limit; overflow happens only if
           we are about to use 0xFFFF+ as item offset. */
        if (count >= 0xFFFF) {
          overflow = BROTLI_TRUE;
          break;
        }
        if (size > limit) size = limit;
        count += size;
      }
      if (!overflow) {
        slot_size[i] = count;
        total_items += count;
        break;
      }
      slot_limit[i]--;
    }
  }

  /* Step 3: transfer data to "slim" hasher. */
  alloc_size = sizeof(PreparedDictionary) + (sizeof(uint32_t) << slot_bits) +
      (sizeof(uint16_t) << bucket_bits) + (sizeof(uint32_t) * total_items) +
      sizeof(uint8_t*);

  result = (PreparedDictionary*)BROTLI_ALLOC(m, uint8_t, alloc_size);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(result)) {
    BROTLI_FREE(m, flat);
    return NULL;
  }
  slot_offsets = (uint32_t*)(&result[1]);
  heads = (uint16_t*)(&slot_offsets[num_slots]);
  items = (uint32_t*)(&heads[num_buckets]);
  source_ref = (uint8_t**)(&items[total_items]);

  result->magic = kLeanPreparedDictionaryMagic;
  result->num_items = total_items;
  result->source_size = (uint32_t)source_size;
  result->hash_bits = hash_bits;
  result->bucket_bits = bucket_bits;
  result->slot_bits = slot_bits;
  BROTLI_UNALIGNED_STORE_PTR(source_ref, source);

  total_items = 0;
  for (i = 0; i < num_slots; ++i) {
    slot_offsets[i] = total_items;
    total_items += slot_size[i];
    slot_size[i] = 0;
  }
  for (i = 0; i < num_buckets; ++i) {
    uint32_t slot = i & slot_mask;
    uint32_t count = num[i];
    uint32_t pos;
    size_t j;
    size_t cursor = slot_size[slot];
    if (count > slot_limit[slot]) count = slot_limit[slot];
    if (count == 0) {
      heads[i] = 0xFFFF;
      continue;
    }
    heads[i] = (uint16_t)cursor;
    cursor += slot_offsets[slot];
    slot_size[slot] += count;
    pos = bucket_heads[i];
    for (j = 0; j < count; j++) {
      items[cursor++] = pos;
      pos = next_bucket[pos];
    }
    items[cursor - 1] |= 0x80000000;
  }

  BROTLI_FREE(m, flat);
  return result;
}